

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void __thiscall Camera::_castShadowRays(Camera *this,Intersection *i,World *world)

{
  undefined8 uVar1;
  value_type pPVar2;
  double dVar3;
  int iVar4;
  reference ppPVar5;
  reference ppSVar6;
  undefined4 extraout_var;
  size_type __n;
  int o;
  ulong uVar7;
  size_type __n_00;
  ulong uVar8;
  ulong uVar9;
  float fVar11;
  float fVar12;
  ColorRGB CVar13;
  ColorRGB c;
  ColorRGB local_f0;
  ColorRGB *local_e0;
  float local_d4;
  Intersection *local_d0;
  double local_c8;
  size_type local_c0;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_b8;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_a8;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_98;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined4 local_78;
  undefined1 local_68 [12];
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  float fVar10;
  
  uVar8 = (ulong)((long)(world->sceneObjects->
                        super__Vector_base<SceneObject_*,_std::allocator<SceneObject_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(world->sceneObjects->
                       super__Vector_base<SceneObject_*,_std::allocator<SceneObject_*>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar7 = (ulong)((long)(world->pointLights->
                        super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(world->pointLights->
                       super__Vector_base<PointLight_*,_std::allocator<PointLight_*>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  Ray::Ray((Ray *)local_68);
  ColorRGB::ColorRGB(&local_f0);
  local_e0 = &i->color;
  __n = 0;
  uVar9 = uVar8 & 0xffffffff;
  if ((int)uVar8 < 1) {
    uVar9 = __n;
  }
  local_d0 = i;
  local_c0 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    local_c0 = __n;
  }
  do {
    if (__n == local_c0) {
      CVar13.b = local_f0.b;
      CVar13.r = local_f0.r;
      CVar13.g = local_f0.g;
      ColorRGB::setColor(local_e0,CVar13);
      return;
    }
    ppPVar5 = std::vector<PointLight_*,_std::allocator<PointLight_*>_>::at(world->pointLights,__n);
    pPVar2 = *ppPVar5;
    local_a8.field_0.z = (local_d0->intersectionPoint).field_0.field_0.z;
    local_b8.field_0.z = (pPVar2->position).field_0.field_0.z - local_a8.field_0.z;
    uVar1 = *(undefined8 *)&(pPVar2->position).field_0;
    local_a8._0_8_ = *(undefined8 *)&(local_d0->intersectionPoint).field_0;
    fVar11 = (float)uVar1 - (float)local_a8._0_8_;
    fVar12 = (float)((ulong)uVar1 >> 0x20) - (float)((ulong)local_a8._0_8_ >> 0x20);
    local_b8._0_8_ = CONCAT44(fVar12,fVar11);
    local_d4 = SQRT(local_b8.field_0.z * local_b8.field_0.z + fVar11 * fVar11 + fVar12 * fVar12);
    Ray::Ray((Ray *)&local_98.field_0,(vec3 *)&local_a8.field_0,(vec3 *)&local_b8.field_0,0.1,
             local_d4);
    fStack_5c = (float)uStack_8c;
    local_68._8_4_ = local_98.field_0.z;
    local_68._0_8_ = local_98._0_8_;
    local_58 = local_88;
    uStack_50 = uStack_80;
    local_48 = local_78;
    __n_00 = 0;
    do {
      if (uVar9 == __n_00) {
        local_c8 = (double)((local_d0->surfaceNormal).field_0.field_0.z * (float)local_58._4_4_ +
                           (local_d0->surfaceNormal).field_0.field_0.x * fStack_5c +
                           (local_d0->surfaceNormal).field_0.field_0.y * (float)(undefined4)local_58
                           );
        dVar3 = log((double)local_d4 * 0.5);
        fVar11 = 0.0;
        if (0.0 <= (float)(local_c8 / dVar3)) {
          fVar11 = (float)(local_c8 / dVar3);
        }
        CVar13 = ColorRGB::operator*(&pPVar2->color,fVar11);
        local_98.field_0.z = CVar13.b;
        local_98._0_8_ = CVar13._0_8_;
        CVar13 = ColorRGB::operator+((ColorRGB *)&local_98.field_0,world->ambientColor);
        CVar13 = ColorRGB::operator*(local_e0,CVar13);
        fVar10 = CVar13.b;
        fVar11 = CVar13.r;
        fVar12 = CVar13.g;
        goto LAB_00104866;
      }
      ppSVar6 = std::vector<SceneObject_*,_std::allocator<SceneObject_*>_>::at
                          (world->sceneObjects,__n_00);
      iVar4 = (*(*ppSVar6)->_vptr_SceneObject[2])(*ppSVar6,(Ray *)local_68);
      __n_00 = __n_00 + 1;
    } while (CONCAT44(extraout_var,iVar4) == 0);
    CVar13 = ColorRGB::operator*(local_e0,0.001);
    fVar10 = CVar13.b;
    fVar11 = CVar13.r;
    fVar12 = CVar13.g;
LAB_00104866:
    c.g = fVar12;
    c.r = fVar11;
    c.b = fVar10;
    CVar13 = ColorRGB::operator+(&local_f0,c);
    local_f0.b = CVar13.b;
    local_f0._0_8_ = CVar13._0_8_;
    __n = __n + 1;
  } while( true );
}

Assistant:

void Camera::_castShadowRays(Intersection *i, World *world) {
    
    int numObjects = world->sceneObjects->size();
    int numLights = world->pointLights->size();
    glm::vec3 lightDir;
    Ray shadowRay;
    PointLight *pl;
    SceneObject *obj;
    float r, intensity;
    ColorRGB ackColor = ColorRGB();
    bool noHit;
    
    for(int l = 0; l < numLights; ++l) {
        pl = world->pointLights->at(l);
        lightDir = pl->position - i->intersectionPoint;
        r = glm::length(lightDir);
        shadowRay = Ray(i->intersectionPoint, lightDir, 0.1, r);
        noHit = true;
        
        for(int o = 0; o < numObjects; ++o) {
            obj = world->sceneObjects->at(o);
            if( obj->intersects(shadowRay) ) {
                ackColor = ackColor + i->color * 0.001;
                noHit = false; break;
            }
        }

        if(noHit) {
			intensity = glm::dot(i->surfaceNormal, shadowRay.dir) * 1 / std::log(0.5*r);
			if(intensity < 0.0) intensity = 0.0;
			ackColor = ackColor + i->color * (pl->color * intensity + world->ambientColor);
        }
    }
    i->color.setColor(ackColor);
}